

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O0

size_t __thiscall ServerManager::addCommand(ServerManager *this,IRCCommand *command)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  pointer this_01;
  undefined4 extraout_var;
  size_type sVar3;
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *server;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
  *__range1;
  IRCCommand *command_local;
  ServerManager *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ::begin(&this->m_servers);
  server = (unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *)
           std::
           vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ::end(&this->m_servers);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
                                *)&server);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
              ::operator*(&__end1);
    this_01 = std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>::operator->(this_00);
    iVar2 = (*(command->super_Command)._vptr_Command[5])();
    IRC_Bot::addCommand(this_01,(IRCCommand *)CONCAT44(extraout_var,iVar2));
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_*,_std::vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>_>
    ::operator++(&__end1);
  }
  sVar3 = std::
          vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
          ::size(&this->m_servers);
  return sVar3;
}

Assistant:

size_t ServerManager::addCommand(IRCCommand *command) {
	for (const auto& server : m_servers) {
		server->addCommand(command->copy());
	}

	return m_servers.size();
}